

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O0

int dwarf_get_debugfission_for_die
              (Dwarf_Die die,Dwarf_Debug_Fission_Per_CU_s *fission_out,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Bool DVar3;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Debug_Fission_Per_CU_s *percu;
  Dwarf_Debug dbg;
  Dwarf_CU_Context_conflict context;
  Dwarf_Error *error_local;
  Dwarf_Debug_Fission_Per_CU_s *fission_out_local;
  Dwarf_Die die_local;
  
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      pDVar2 = die->di_cu_context;
      pDVar1 = pDVar2->cc_dbg;
      DVar3 = _dwarf_file_has_debug_fission_index(pDVar1);
      if (DVar3 == 0) {
        die_local._4_4_ = -1;
      }
      else {
        if ((pDVar2->cc_unit_type == 2) || (pDVar2->cc_unit_type == 6)) {
          DVar3 = _dwarf_file_has_debug_fission_tu_index(pDVar1);
          if (DVar3 == 0) {
            return -1;
          }
        }
        else if ((pDVar2->cc_unit_type == 5) &&
                (DVar3 = _dwarf_file_has_debug_fission_cu_index(pDVar1), DVar3 == 0)) {
          return -1;
        }
        if ((pDVar2->cc_dwp_offsets).pcu_type == (char *)0x0) {
          die_local._4_4_ = -1;
        }
        else {
          memcpy(fission_out,&pDVar2->cc_dwp_offsets,0xe8);
          die_local._4_4_ = 0;
        }
      }
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_get_debugfission_for_die(Dwarf_Die die,
    struct Dwarf_Debug_Fission_Per_CU_s *fission_out,
    Dwarf_Error *error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Debug dbg = 0;
    struct Dwarf_Debug_Fission_Per_CU_s * percu = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    context = die->di_cu_context;
    dbg = context->cc_dbg;
    if (!_dwarf_file_has_debug_fission_index(dbg)) {
        return DW_DLV_NO_ENTRY;
    }

    /*  Logic should work for DW4 and DW5. */
    if (context->cc_unit_type == DW_UT_type||
        context->cc_unit_type == DW_UT_split_type ) {
        if (!_dwarf_file_has_debug_fission_tu_index(dbg)) {
            return DW_DLV_NO_ENTRY;
        }
    } else if (context->cc_unit_type == DW_UT_split_compile) {
        if (!_dwarf_file_has_debug_fission_cu_index(dbg)) {
            return DW_DLV_NO_ENTRY;
        }
    } else { /* Fall through*/ }
    percu = &context->cc_dwp_offsets;
    if (!percu->pcu_type) {
        return DW_DLV_NO_ENTRY;
    }
    *fission_out = *percu;
    return DW_DLV_OK;
}